

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void load_history(void)

{
  ulong uVar1;
  long lVar2;
  byte *pbVar3;
  char (*to) [2048];
  char (*text) [2048];
  int max_files;
  Name local_38;
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&max_files,5);
  if (10 < max_files) {
    max_files = 10;
  }
  lVar2 = 0x20;
  to = relative_history;
  text = absolute_history;
  for (uVar1 = 0; (long)uVar1 < (long)max_files; uVar1 = uVar1 + 1) {
    Fl_Preferences::Name::Name(&local_38,"file%d",uVar1 & 0xffffffff);
    Fl_Preferences::get(&fluid_prefs,local_38.data_,*text,"",0x800);
    Fl_Preferences::Name::~Name(&local_38);
    if ((*text)[0] == '\0') break;
    fl_filename_relative(*to,0x800,*text);
    if (uVar1 == 9) {
      history_item[9].flags = 0x80;
    }
    else {
      *(undefined4 *)((long)&history_item->text + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x38;
    to = to + 1;
    text = text + 1;
  }
  pbVar3 = (byte *)((long)&history_item->text + lVar2);
  for (; uVar1 < 10; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      pbVar3[-0x38] = pbVar3[-0x38] | 0x80;
    }
    *pbVar3 = *pbVar3 | 0x10;
    pbVar3 = pbVar3 + 0x38;
  }
  return;
}

Assistant:

void load_history() {
  int	i;		// Looping var
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  for (i = 0; i < max_files; i ++) {
    fluid_prefs.get( Fl_Preferences::Name("file%d", i), absolute_history[i], "", sizeof(absolute_history[i]));
    if (absolute_history[i][0]) {
      // Make a relative version of the filename for the menu...
      fl_filename_relative(relative_history[i], sizeof(relative_history[i]),
                           absolute_history[i]);

      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
}